

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O1

string * MyCompiler::visitFactor
                   (string *__return_storage_ptr__,Factor *ast,
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *usedIdents,int *tempIdentCounter)

{
  int iVar1;
  pointer pcVar2;
  element_type *peVar3;
  
  iVar1 = (ast->super_AbstractAstNode).caseNum;
  if (iVar1 == 1) {
    peVar3 = (ast->pNumber).super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  else {
    if (iVar1 != 0) {
      visitExpression(__return_storage_ptr__,
                      (ast->pExpression).
                      super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      result,usedIdents,tempIdentCounter);
      return __return_storage_ptr__;
    }
    peVar3 = (element_type *)
             (ast->pIdent).super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (peVar3->super_AbstractAstNode).value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (peVar3->super_AbstractAstNode).value._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string MyCompiler::visitFactor(MyCompiler::Factor &ast,
                                    std::vector<std::array<std::string, 4>> &result,
                                    std::unordered_set<std::string> &usedIdents,
                                    int &tempIdentCounter)
{
    switch (ast.caseNum)
    {
        case 0:
            return ast.pIdent->value;
        case 1:
            return ast.pNumber->value;
        default:
            return visitExpression(*ast.pExpression, result, usedIdents, tempIdentCounter);
    }
}